

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *v,bool show_full_path)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
  lVar3 = *(long *)this;
  if (*(long *)(this + 8) != lVar3) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      Path::full_path_name_abi_cxx11_(&local_1d8,(Path *)(lVar3 + lVar1));
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if (uVar2 != (*(long *)(this + 8) - *(long *)this >> 4) * 0x4ec4ec4ec4ec4ec5 - 1U) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      uVar2 = uVar2 + 1;
      lVar3 = *(long *)this;
      lVar1 = lVar1 + 0xd0;
    } while (uVar2 < (ulong)((*(long *)(this + 8) - lVar3 >> 4) * 0x4ec4ec4ec4ec4ec5));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::vector<Path> &v, bool show_full_path) {
  // TODO(syoyo): indent
  std::stringstream ss;
  ss << "[";

  for (size_t i = 0; i < v.size(); i++) {
    ss << to_string(v[i], show_full_path);
    if (i != (v.size() - 1)) {
      ss << ", ";
    }
  }
  ss << "]";
  return ss.str();
}